

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

int xmlACatalogAdd(xmlCatalogPtr catal,xmlChar *type,xmlChar *orig,xmlChar *replace)

{
  _xmlCatalogEntry **pp_Var1;
  _xmlCatalogEntry *p_Var2;
  _xmlCatalogEntry *p_Var3;
  int iVar4;
  int iVar5;
  xmlCatalogEntryPtr pxVar6;
  xmlHashTablePtr pxVar7;
  xmlCatalogEntryPtr pxVar8;
  void *pvVar9;
  xmlChar *pxVar10;
  _xmlCatalogEntry *p_Var11;
  xmlCatalogEntryType xVar12;
  
  iVar5 = -1;
  if (catal != (xmlCatalogPtr)0x0) {
    if (catal->type == XML_XML_CATALOG_TYPE) {
      pxVar6 = catal->xml;
      if ((pxVar6 != (xmlCatalogEntryPtr)0x0) && ((uint)(pxVar6->type + XML_CATA_REMOVED) < 2)) {
        pp_Var1 = &pxVar6->children;
        if (pxVar6->children == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(pxVar6);
        }
        p_Var2 = *pp_Var1;
        iVar4 = xmlStrEqual(type,"system");
        xVar12 = XML_CATA_SYSTEM;
        if (iVar4 == 0) {
          iVar4 = xmlStrEqual(type,(xmlChar *)"public");
          xVar12 = XML_CATA_PUBLIC;
          if (iVar4 == 0) {
            iVar4 = xmlStrEqual(type,(xmlChar *)"rewriteSystem");
            xVar12 = XML_CATA_REWRITE_SYSTEM;
            if (iVar4 == 0) {
              iVar4 = xmlStrEqual(type,(xmlChar *)"delegatePublic");
              xVar12 = XML_CATA_DELEGATE_PUBLIC;
              if (iVar4 == 0) {
                iVar4 = xmlStrEqual(type,(xmlChar *)"delegateSystem");
                xVar12 = XML_CATA_DELEGATE_SYSTEM;
                if (iVar4 == 0) {
                  iVar4 = xmlStrEqual(type,"uri");
                  xVar12 = XML_CATA_URI;
                  if (iVar4 == 0) {
                    iVar4 = xmlStrEqual(type,(xmlChar *)"rewriteURI");
                    xVar12 = XML_CATA_REWRITE_URI;
                    if (iVar4 == 0) {
                      iVar4 = xmlStrEqual(type,(xmlChar *)"delegateURI");
                      xVar12 = XML_CATA_DELEGATE_URI;
                      if (iVar4 == 0) {
                        iVar4 = xmlStrEqual(type,(xmlChar *)"nextCatalog");
                        xVar12 = XML_CATA_NEXT_CATALOG;
                        if (iVar4 == 0) {
                          iVar4 = xmlStrEqual(type,"catalog");
                          xVar12 = (xmlCatalogEntryType)(iVar4 != 0);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        if (xVar12 == XML_CATA_NONE) {
          if (xmlDebugCatalogs != 0) {
            xmlCatalogPrintDebug("Failed to add unknown element %s to catalog\n",type);
          }
        }
        else {
          p_Var3 = *pp_Var1;
          if (*pp_Var1 == (_xmlCatalogEntry *)0x0) {
            p_Var11 = (_xmlCatalogEntry *)0x0;
          }
          else {
            do {
              p_Var11 = p_Var3;
              if (((orig != (xmlChar *)0x0) && (p_Var11->type == xVar12)) &&
                 (iVar5 = xmlStrEqual(orig,p_Var11->name), iVar5 != 0)) {
                if (xmlDebugCatalogs != 0) {
                  xmlCatalogPrintDebug("Updating element %s to catalog\n",type);
                }
                if (p_Var11->value != (xmlChar *)0x0) {
                  (*xmlFree)(p_Var11->value);
                }
                if (p_Var11->URL != (xmlChar *)0x0) {
                  (*xmlFree)(p_Var11->URL);
                }
                pxVar10 = xmlStrdup(replace);
                p_Var11->value = pxVar10;
                pxVar10 = xmlStrdup(replace);
                p_Var11->URL = pxVar10;
                return 0;
              }
              p_Var3 = p_Var11->next;
            } while (p_Var11->next != (_xmlCatalogEntry *)0x0);
          }
          if (xmlDebugCatalogs != 0) {
            xmlCatalogPrintDebug("Adding element %s to catalog\n",type);
          }
          iVar5 = 0;
          pxVar8 = xmlNewCatalogEntry(xVar12,orig,replace,(xmlChar *)0x0,pxVar6->prefer,
                                      (xmlCatalogEntryPtr)0x0);
          if (p_Var11 == (_xmlCatalogEntry *)0x0) {
            p_Var11 = (_xmlCatalogEntry *)pp_Var1;
          }
          p_Var11->next = pxVar8;
          if (p_Var2 == (_xmlCatalogEntry *)0x0) {
            pxVar6->type = XML_CATA_CATALOG;
            pvVar9 = xmlHashLookup(xmlCatalogXMLFiles,pxVar6->URL);
            if (pvVar9 != (void *)0x0) {
              *(_xmlCatalogEntry **)((long)pvVar9 + 0x10) = *pp_Var1;
            }
          }
        }
      }
    }
    else {
      iVar4 = xmlStrEqual(type,"SYSTEM");
      xVar12 = SGML_CATA_SYSTEM;
      if (iVar4 == 0) {
        iVar4 = xmlStrEqual(type,(xmlChar *)"PUBLIC");
        xVar12 = SGML_CATA_PUBLIC;
        if (iVar4 == 0) {
          iVar4 = xmlStrEqual(type,(xmlChar *)"DELEGATE");
          xVar12 = SGML_CATA_DELEGATE;
          if (iVar4 == 0) {
            iVar4 = xmlStrEqual(type,"ENTITY");
            xVar12 = SGML_CATA_ENTITY;
            if (iVar4 == 0) {
              iVar4 = xmlStrEqual(type,(xmlChar *)"DOCTYPE");
              xVar12 = SGML_CATA_DOCTYPE;
              if (iVar4 == 0) {
                iVar4 = xmlStrEqual(type,(xmlChar *)"LINKTYPE");
                xVar12 = SGML_CATA_LINKTYPE;
                if (iVar4 == 0) {
                  iVar4 = xmlStrEqual(type,(xmlChar *)"NOTATION");
                  xVar12 = SGML_CATA_NOTATION;
                  if (iVar4 == 0) {
                    iVar4 = xmlStrEqual(type,(xmlChar *)"SGMLDECL");
                    xVar12 = SGML_CATA_SGMLDECL;
                    if (iVar4 == 0) {
                      iVar4 = xmlStrEqual(type,(xmlChar *)"DOCUMENT");
                      xVar12 = SGML_CATA_DOCUMENT;
                      if (iVar4 == 0) {
                        iVar4 = xmlStrEqual(type,"CATALOG");
                        xVar12 = SGML_CATA_CATALOG;
                        if (iVar4 == 0) {
                          iVar4 = xmlStrEqual(type,(xmlChar *)"BASE");
                          xVar12 = SGML_CATA_BASE;
                          if (iVar4 == 0) {
                            xVar12 = XML_CATA_NONE;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      if (xVar12 != XML_CATA_NONE) {
        pxVar6 = xmlNewCatalogEntry(xVar12,orig,replace,(xmlChar *)0x0,XML_CATA_PREFER_NONE,
                                    (xmlCatalogEntryPtr)0x0);
        if (catal->sgml == (xmlHashTablePtr)0x0) {
          pxVar7 = xmlHashCreate(10);
          catal->sgml = pxVar7;
        }
        iVar5 = xmlHashAddEntry(catal->sgml,orig,pxVar6);
        if (iVar5 < 0) {
          xmlFreeCatalogEntry(pxVar6,orig);
        }
      }
    }
  }
  return iVar5;
}

Assistant:

int
xmlACatalogAdd(xmlCatalogPtr catal, const xmlChar * type,
              const xmlChar * orig, const xmlChar * replace)
{
    int res = -1;

    if (catal == NULL)
	return(-1);

    if (catal->type == XML_XML_CATALOG_TYPE) {
        res = xmlAddXMLCatalog(catal->xml, type, orig, replace);
    } else {
        xmlCatalogEntryType cattype;

        cattype = xmlGetSGMLCatalogEntryType(type);
        if (cattype != XML_CATA_NONE) {
            xmlCatalogEntryPtr entry;

            entry = xmlNewCatalogEntry(cattype, orig, replace, NULL,
                                       XML_CATA_PREFER_NONE, NULL);
	    if (catal->sgml == NULL)
		catal->sgml = xmlHashCreate(10);
            res = xmlHashAddEntry(catal->sgml, orig, entry);
            if (res < 0)
                xmlFreeCatalogEntry(entry, NULL);
        }
    }
    return (res);
}